

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void __thiscall
Pubkey_VerifyEcSignature_Test::Pubkey_VerifyEcSignature_Test(Pubkey_VerifyEcSignature_Test *this)

{
  Pubkey_VerifyEcSignature_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Pubkey_VerifyEcSignature_Test_009e0778;
  return;
}

Assistant:

TEST(Pubkey, VerifyEcSignature) {
  Pubkey pubkey(
      "031777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb");
  ByteData256 sighash(
      "2a67f03e63a6a422125878b40b82da593be8d4efaafe88ee528af6e5a9955c6e");
  ByteData signature(
      "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb"
      "12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c");
  ByteData bad_signature1(
      "0e68b55347fe37338beb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb"
      "12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f");
  ByteData bad_signature2(
      "0e68b55347fe37338ceb3c28920267c5915a0c474d1dcafc65b087b9b3819cae6ae5e8fb"
      "12d669a63127abb4724070f8bd232a9efe3704e6544296a843a64f2c");

  EXPECT_TRUE(pubkey.VerifyEcSignature(sighash, signature));

  EXPECT_FALSE(pubkey.VerifyEcSignature(sighash, bad_signature1));

  EXPECT_FALSE(pubkey.VerifyEcSignature(sighash, bad_signature2));
}